

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O1

void process_firmware_event(uevent *uevent)

{
  bool bVar1;
  int iVar2;
  int __fd;
  int __fd_00;
  int iVar3;
  size_t __n;
  ssize_t sVar4;
  long lVar5;
  char *fmt;
  char *root;
  char *file;
  char *data;
  char *loading;
  stat st;
  char *local_1100;
  int local_10f4;
  char *local_10f0;
  int local_10e4;
  long local_10e0;
  char *local_10d8;
  char *local_10d0;
  stat local_10c8;
  undefined1 local_1038 [4104];
  
  log_write(6,"<6>init: firmware event { \'%s\', \'%s\' }\n",uevent->path,uevent->firmware);
  iVar2 = asprintf(&local_1100,"/sys%s/",uevent->path);
  if (iVar2 == -1) {
    return;
  }
  iVar2 = asprintf(&local_10d0,"%sloading",local_1100);
  if (iVar2 == -1) goto LAB_0010846e;
  iVar2 = asprintf(&local_10d8,"%sdata",local_1100);
  if (iVar2 != -1) {
    iVar2 = asprintf(&local_10f0,"/etc/firmware/%s",uevent->firmware);
    if (iVar2 != -1) {
      iVar2 = open(local_10d0,1);
      if (-1 < iVar2) {
        __fd = open(local_10d8,1);
        if (-1 < __fd) {
          __fd_00 = open(local_10f0,0);
          if (-1 < __fd_00) {
            iVar3 = fstat(__fd_00,&local_10c8);
            if (iVar3 < 0) {
LAB_001083f3:
              fmt = "<6>init: firmware copy failure { \'%s\', \'%s\' }\n";
            }
            else {
              local_10e0 = local_10c8.st_size;
              local_10f4 = iVar2;
              write(iVar2,"1",1);
              iVar3 = 0;
              local_10e4 = __fd_00;
              do {
                if (local_10e0 < 1) break;
                __n = read(local_10e4,local_1038,0x1000);
                if (__n == 0) {
LAB_001083cb:
                  bVar1 = false;
                }
                else {
                  if ((long)__n < 0) {
                    iVar3 = -1;
                    goto LAB_001083cb;
                  }
                  local_10e0 = local_10e0 - __n;
                  do {
                    bVar1 = (long)__n < 1;
                    if ((long)__n < 1) goto LAB_001083ce;
                    sVar4 = write(__fd,local_1038,__n);
                    lVar5 = 0;
                    if (0 < sVar4) {
                      lVar5 = sVar4;
                    }
                    __n = __n - lVar5;
                  } while (0 < sVar4);
                  iVar3 = -1;
                }
LAB_001083ce:
              } while (bVar1);
              __fd_00 = local_10e4;
              iVar2 = local_10f4;
              if (iVar3 != 0) {
                write(local_10f4,"-1",2);
                goto LAB_001083f3;
              }
              write(local_10f4,"0",1);
              fmt = "<6>init: firmware copy success { \'%s\', \'%s\' }\n";
            }
            log_write(6,fmt,local_1100,local_10f0);
            close(__fd_00);
          }
          close(__fd);
        }
        close(iVar2);
      }
      free(local_10f0);
    }
    free(local_10d8);
  }
  free(local_10d0);
LAB_0010846e:
  free(local_1100);
  return;
}

Assistant:

static void process_firmware_event(struct uevent *uevent)
{
    char *root, *loading, *data, *file;
    int l, loading_fd, data_fd, fw_fd;

    log_event_print("firmware event { '%s', '%s' }\n",
                    uevent->path, uevent->firmware);

    l = asprintf(&root, SYSFS_PREFIX"%s/", uevent->path);
    if (l == -1)
        return;

    l = asprintf(&loading, "%sloading", root);
    if (l == -1)
        goto root_free_out;

    l = asprintf(&data, "%sdata", root);
    if (l == -1)
        goto loading_free_out;

    l = asprintf(&file, FIRMWARE_DIR"/%s", uevent->firmware);
    if (l == -1)
        goto data_free_out;

    loading_fd = open(loading, O_WRONLY);
    if(loading_fd < 0)
        goto file_free_out;

    data_fd = open(data, O_WRONLY);
    if(data_fd < 0)
        goto loading_close_out;

    fw_fd = open(file, O_RDONLY);
    if(fw_fd < 0)
        goto data_close_out;

    if(!load_firmware(fw_fd, loading_fd, data_fd))
        log_event_print("firmware copy success { '%s', '%s' }\n", root, file);
    else
        log_event_print("firmware copy failure { '%s', '%s' }\n", root, file);

    close(fw_fd);
data_close_out:
    close(data_fd);
loading_close_out:
    close(loading_fd);
file_free_out:
    free(file);
data_free_out:
    free(data);
loading_free_out:
    free(loading);
root_free_out:
    free(root);
}